

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

void __thiscall kratos::InlineGeneratorVisitor::visit(InlineGeneratorVisitor *this,Generator *top)

{
  element_type *peVar1;
  Generator *this_00;
  bool bVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  GeneratorException *this_01;
  undefined1 child [8];
  PortInfo PVar5;
  initializer_list<kratos::IRNode_*> __l;
  undefined1 local_e0 [8];
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  child_generators;
  vector<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
  inline_stmts;
  undefined1 local_a8 [32];
  undefined1 local_88 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_names;
  PortInfo res;
  allocator<char> local_32;
  allocator_type local_31;
  
  Generator::get_child_generators
            ((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
              *)local_e0,top);
  if (local_e0 !=
      (undefined1  [8])
      child_generators.
      super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar2 = std::
            all_of<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Generator>*,std::vector<std::shared_ptr<kratos::Generator>,std::allocator<std::shared_ptr<kratos::Generator>>>>,kratos::InlineGeneratorVisitor::visit(kratos::Generator*)::_lambda(auto:1_const&)_1_>
                      ();
    if (bVar2) {
      child_generators.
      super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = false;
      for (child = local_e0;
          child != (undefined1  [8])
                   child_generators.
                   super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          child = (undefined1  [8])((long)child + 0x10)) {
        peVar1 = (((shared_ptr<kratos::Generator> *)child)->
                 super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_88,"inline",(allocator<char> *)local_a8);
        bVar3 = IRNode::has_attribute(&peVar1->super_IRNode,(string *)local_88);
        std::__cxx11::string::~string((string *)local_88);
        if (bVar3) {
          peVar1 = (((shared_ptr<kratos::Generator> *)child)->
                   super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          if (((peVar1->is_cloned_ != false) ||
              ((peVar1->lib_files_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               (peVar1->lib_files_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)) || ((peVar1->is_external_ & 1U) != 0)) {
            this_01 = (GeneratorException *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_88,"Cannot inline cloned or external modules",&local_32);
            port_names._M_t._M_impl.super__Rb_tree_header._M_node_count =
                 (size_t)(((shared_ptr<kratos::Generator> *)child)->
                         super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            __l._M_len = 2;
            __l._M_array = (iterator)&port_names._M_t._M_impl.super__Rb_tree_header._M_node_count;
            std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                      ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)local_a8,__l,
                       &local_31);
            GeneratorException::GeneratorException
                      (this_01,(string *)local_88,
                       (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)local_a8);
            __cxa_throw(this_01,&GeneratorException::typeinfo,std::runtime_error::~runtime_error);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_88,&(peVar1->ports_)._M_t);
          for (p_Var4 = port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var4 != (_Rb_tree_node_base *)&port_names;
              p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
            Generator::get_port((Generator *)local_a8,
                                (string *)
                                (((shared_ptr<kratos::Generator> *)child)->
                                super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr);
            PVar5 = get_port_assignment((Port *)local_a8._0_8_);
            port_names._M_t._M_impl.super__Rb_tree_header._M_node_count =
                 CONCAT44(port_names._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
                          PVar5.direction);
            if (PVar5.stmt != (AssignStmt *)0x0) {
              std::
              vector<kratos::InlineGeneratorVisitor::PortInfo,std::allocator<kratos::InlineGeneratorVisitor::PortInfo>>
              ::emplace_back<kratos::InlineGeneratorVisitor::PortInfo&>
                        ((vector<kratos::InlineGeneratorVisitor::PortInfo,std::allocator<kratos::InlineGeneratorVisitor::PortInfo>>
                          *)&child_generators.
                             super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (PortInfo *)&port_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
          }
          this_00 = (((shared_ptr<kratos::Generator> *)child)->
                    super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a8,&this_00->instance_name,"_");
          Generator::transfer_content(this_00,top,(string *)local_a8);
          std::__cxx11::string::~string((string *)local_a8);
          Generator::remove_child_generator(top,(shared_ptr<kratos::Generator> *)child);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_88);
          bVar2 = true;
        }
      }
      if (bVar2) {
        optimize_passthrough_assignment
                  (top,(vector<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
                        *)&child_generators.
                           super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      std::
      _Vector_base<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
      ::~_Vector_base((_Vector_base<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
                       *)&child_generators.
                          super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  std::
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
           *)local_e0);
  return;
}

Assistant:

void visit(Generator* top) override {
        auto child_generators = top->get_child_generators();
        if (child_generators.empty()) return;
        // calculate if we should inline or not
        bool start_inline =
            std::all_of(child_generators.begin(), child_generators.end(),
                        [](auto const& gen) { return gen->get_child_generator_size() == 0; });
        if (!start_inline) return;

        std::vector<PortInfo> inline_stmts;
        bool has_inlined_inst = false;
        for (auto const& child : child_generators) {
            if (!child->has_attribute("inline")) {
                continue;
            }
            if (child->is_cloned() || child->external()) {
                throw GeneratorException("Cannot inline cloned or external modules",
                                         {child.get(), top});
            }
            has_inlined_inst = true;
            // figure out which port we should focus on
            auto port_names = child->get_port_names();
            for (auto const& port_name : port_names) {
                auto const& port = child->get_port(port_name);
                auto res = get_port_assignment(port.get());
                if (res.stmt) {
                    inline_stmts.emplace_back(res);
                }
            }

            child->transfer_content(*top, child->instance_name + "_");
            top->remove_child_generator(child);
        }
        if (has_inlined_inst) {
            optimize_passthrough_assignment(top, inline_stmts);
        }
    }